

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O0

void __thiscall
test_adjacency_graph_swap_Test::~test_adjacency_graph_swap_Test
          (test_adjacency_graph_swap_Test *this)

{
  test_adjacency_graph_swap_Test *this_local;
  
  ~test_adjacency_graph_swap_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_adjacency_graph, swap) {
  Adjacency_Graph<false> graph_0({{0, 1}, {1, 2}, {2, 3}, {0, 3}});  // quadrilateral graph
  Adjacency_Graph<false> graph_1({{0, 1}, {1, 2}, {0, 2}});          // 2-simplex graph

  graph_0.swap(graph_1);
  EXPECT_EQ(graph_0.size_vertex(), 3);
  EXPECT_EQ(graph_0.size_edge(), 3);
  EXPECT_EQ(graph_1.size_vertex(), 4);
  EXPECT_EQ(graph_1.size_edge(), 4);

  EXPECT_DOUBLE_EQ(graph_0[0][0], 1);
  EXPECT_DOUBLE_EQ(graph_0[0][1], 2);
  EXPECT_DOUBLE_EQ(graph_0[1][0], 0);
  EXPECT_DOUBLE_EQ(graph_0[1][1], 2);
  EXPECT_DOUBLE_EQ(graph_0[2][0], 0);
  EXPECT_DOUBLE_EQ(graph_0[2][1], 1);
  EXPECT_DOUBLE_EQ(graph_1[0][0], 1);
  EXPECT_DOUBLE_EQ(graph_1[0][1], 3);
  EXPECT_DOUBLE_EQ(graph_1[1][0], 0);
  EXPECT_DOUBLE_EQ(graph_1[1][1], 2);
  EXPECT_DOUBLE_EQ(graph_1[2][0], 1);
  EXPECT_DOUBLE_EQ(graph_1[2][1], 3);
  EXPECT_DOUBLE_EQ(graph_1[3][0], 0);
  EXPECT_DOUBLE_EQ(graph_1[3][1], 2);
}